

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImGuiDockNode *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *in_RDI;
  ImVec2 IVar3;
  ImGuiDockNode *node;
  bool can_move_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar4;
  
  pIVar2 = GImGui;
  FocusWindow((ImGuiWindow *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  SetActiveID(in_RDI->MoveId,in_RDI);
  pIVar2->NavDisableHighlight = true;
  IVar3 = ::operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x1a8e39);
  pIVar2->ActiveIdClickOffset = IVar3;
  bVar4 = true;
  if (((in_RDI->Flags & 4U) != 0) || ((in_RDI->RootWindow->Flags & 4U) != 0)) {
    bVar4 = false;
  }
  pIVar1 = in_RDI->DockNodeAsHost;
  if (((pIVar1 != (ImGuiDockNode *)0x0) && (pIVar1->VisibleWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar1->VisibleWindow->Flags & 4U) != 0)) {
    bVar4 = false;
  }
  if (bVar4) {
    pIVar2->MovingWindow = in_RDI;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (ImGuiDockNode* node = window->DockNodeAsHost)
        if (node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove))
            can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}